

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

wchar_t cmp_desc_prio(void *left,void *right)

{
  wchar_t wVar1;
  ui_entry *entry;
  ui_entry *entry_00;
  char *name;
  long lVar2;
  uint uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  long in_RAX;
  wchar_t ind;
  undefined8 uStack_38;
  
  name = category_for_cmp_desc_prio;
  entry = *left;
  entry_00 = *right;
  if (category_for_cmp_desc_prio != (char *)0x0) {
    uStack_38 = in_RAX;
    wVar4 = ui_entry_search_categories
                      (entry,category_for_cmp_desc_prio,(int *)((long)&uStack_38 + 4));
    lVar2 = uStack_38;
    uVar3 = uStack_38._4_4_;
    wVar5 = ui_entry_search_categories(entry_00,name,(int *)((long)&uStack_38 + 4));
    uStack_38._4_4_ = -(uint)(wVar5 == L'\0') | uStack_38._4_4_;
    if (lVar2 < 0 || wVar4 == L'\0') {
      wVar4 = L'\x01';
      if ((int)uStack_38._4_4_ < 0) goto LAB_001e17a4;
    }
    else {
      wVar4 = L'\xffffffff';
      if (-1 < (int)uStack_38._4_4_) {
        wVar5 = entry_00->categories[uStack_38._4_4_].priority;
        wVar1 = entry->categories[uVar3].priority;
        if ((wVar1 <= wVar5) && (wVar4 = L'\x01', wVar5 <= wVar1)) goto LAB_001e17a4;
      }
    }
    return wVar4;
  }
LAB_001e17a4:
  wVar4 = strcmp(entry->name,entry_00->name);
  return wVar4;
}

Assistant:

static int cmp_desc_prio(const void *left, const void *right)
{
	const struct ui_entry *eleft =
		*((const struct ui_entry* const *) left);
	const struct ui_entry *eright =
		*((const struct ui_entry* const *) right);
	int left_ind = -1, right_ind = -1;
	int result;

	if (category_for_cmp_desc_prio) {
		int ind;

		if (ui_entry_search_categories(eleft,
			category_for_cmp_desc_prio, &ind)) {
			left_ind = ind;
		}
		if (ui_entry_search_categories(eright,
			category_for_cmp_desc_prio, &ind)) {
			right_ind = ind;
		}
	}
	if (left_ind >= 0) {
		if (right_ind >= 0) {
			if (eleft->categories[left_ind].priority >
				eright->categories[right_ind].priority) {
				result = -1;
			} else if (eleft->categories[left_ind].priority <
				   eright->categories[right_ind].priority) {
				result = 1;
			} else {
				result = strcmp(eleft->name, eright->name);
			}
		} else {
			/*
			 * right is not in the sort category so it should be
			 * pushed toward the end.
			 */
			result = -1;
		}
	} else if (right_ind >= 0) {
		/*
		 * left is not in the sort category so it should be pushed
		 * towards the end.
		 */
		result = 1;
	} else {
		result = strcmp(eleft->name, eright->name);
	}
	return result;
}